

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasHessian_ASA_FSA.c
# Opt level: O1

int rhsQBS1(sunrealtype tt,N_Vector yy,N_Vector yp,N_Vector *yyS,N_Vector *ypS,N_Vector yyB,
           N_Vector ypB,N_Vector rhsBQS,void *user_dataB)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  pdVar7 = *(double **)((long)yy->content + 0x10);
  dVar1 = pdVar7[1];
  dVar2 = pdVar7[2];
  pdVar8 = *(double **)((long)yyB->content + 0x10);
  pdVar9 = *(double **)((long)(*yyS)->content + 0x10);
  dVar12 = pdVar8[1] - *pdVar8;
  dVar3 = *pdVar7;
  pdVar7 = *(double **)((long)rhsBQS->content + 0x10);
  dVar13 = dVar1 * dVar2;
  dVar4 = *pdVar9;
  dVar5 = pdVar9[2];
  dVar6 = pdVar9[1];
  dVar10 = pdVar8[3];
  dVar11 = pdVar8[4];
  *pdVar7 = -dVar3 * dVar12;
  pdVar7[1] = dVar13 * dVar12;
  pdVar7[2] = dVar3 * (dVar10 - dVar11) + -dVar4 * dVar12;
  pdVar7[3] = dVar13 * (dVar11 - dVar10) + (dVar2 * dVar6 + dVar1 * dVar5) * dVar12;
  return 0;
}

Assistant:

static int rhsQBS1(sunrealtype tt, N_Vector yy, N_Vector yp, N_Vector* yyS,
                   N_Vector* ypS, N_Vector yyB, N_Vector ypB, N_Vector rhsBQS,
                   void* user_dataB)
{
  sunrealtype y1, y2, y3;
  sunrealtype l1, l2, m1, m2;
  sunrealtype s1, s2, s3;
  sunrealtype l21;

  /* The y vector */
  y1 = Ith(yy, 1);
  y2 = Ith(yy, 2);
  y3 = Ith(yy, 3);

  /* The lambda vector. */
  l1 = Ith(yyB, 1);
  l2 = Ith(yyB, 2);

  /* The mu vector. */
  m1 = Ith(yyB, 4);
  m2 = Ith(yyB, 5);

  /* The sensitivity with respect to p1 */
  s1 = Ith(yyS[0], 1);
  s2 = Ith(yyS[0], 2);
  s3 = Ith(yyS[0], 3);

  /* Temporary variables */
  l21 = l2 - l1;

  Ith(rhsBQS, 1) = -y1 * l21;
  Ith(rhsBQS, 2) = y2 * y3 * l21;

  Ith(rhsBQS, 3) = y1 * (m1 - m2) - s1 * l21;
  Ith(rhsBQS, 4) = y2 * y3 * (m2 - m1) + (y3 * s2 + y2 * s3) * l21;

  return (0);
}